

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundatanode_inmem.c
# Opt level: O1

SUNErrCode
SUNDataNode_CreateList_InMem
          (sundataindex init_size,SUNContext_conflict sunctx,SUNDataNode *node_out)

{
  SUNErrCode SVar1;
  SUNDataNode pSVar2;
  undefined8 *puVar3;
  void *pvVar4;
  SUNDataNode node;
  SUNDataNode local_28;
  
  pSVar2 = sunDataNode_CreateCommon_InMem(sunctx);
  pSVar2->dtype = SUNDATANODE_LIST;
  local_28 = pSVar2;
  if (-1 < init_size) {
    puVar3 = (undefined8 *)malloc(0x20);
    if (puVar3 != (undefined8 *)0x0) {
      pvVar4 = malloc(init_size * 8);
      puVar3[2] = pvVar4;
      if (pvVar4 != (void *)0x0) {
        *puVar3 = 0;
        puVar3[1] = init_size;
        puVar3[3] = sunDataNode_FreeValue_InMem;
        goto LAB_00107a58;
      }
    }
  }
  puVar3 = (undefined8 *)0x0;
LAB_00107a58:
  *(undefined8 **)((long)pSVar2->content + 0x30) = puVar3;
  if (puVar3 == (undefined8 *)0x0) {
    sunDataNode_DestroyCommon_InMem(&local_28);
    SVar1 = -0x2705;
  }
  else {
    *node_out = pSVar2;
    SVar1 = 0;
  }
  return SVar1;
}

Assistant:

SUNErrCode SUNDataNode_CreateList_InMem(sundataindex init_size,
                                        SUNContext sunctx, SUNDataNode* node_out)
{
  SUNFunctionBegin(sunctx);

  SUNDataNode node = sunDataNode_CreateCommon_InMem(sunctx);

  BASE_MEMBER(node, dtype) = SUNDATANODE_LIST;
  IMPL_MEMBER(node, anon_children) =
    SUNStlVector_SUNDataNode_New(init_size, sunDataNode_FreeValue_InMem);
  if (IMPL_MEMBER(node, anon_children) == NULL)
  {
    sunDataNode_DestroyCommon_InMem(&node);
    return SUN_ERR_MEM_FAIL;
  }

  *node_out = node;
  return SUN_SUCCESS;
}